

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

bool __thiscall EventDispatcher::handleEvent(EventDispatcher *this,Event *ev)

{
  int iVar1;
  
  if (ev == (Event *)0x0) {
    jh_log_print(2,"bool EventDispatcher::handleEvent(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0x15b,"called with NULL event");
  }
  else {
    iVar1 = *(int *)&(ev->super_RefCount).field_0xc;
    if (iVar1 == -3) {
      handleSyncEvent(this,ev);
    }
    else {
      if (iVar1 == -2) {
        (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[6])();
        RefCount::Release(&ev->super_RefCount);
        return true;
      }
      EventDispatcherHelper::dispatchEvent(&this->mDispatcher,ev);
      RefCount::Release(&ev->super_RefCount);
    }
  }
  return false;
}

Assistant:

bool EventDispatcher::handleEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	bool done = false;
	
	if ( ev == NULL )
	{
		LOG_WARN( "called with NULL event" );
		return false;
	}
	
	switch ( ev->getEventId() )
	{
		case Event::kShutdownEventId:
			LOG( "kShutdownEventId received" );
			removeAll();
			done = true;
			ev->Release();
			break;

		case Event::kSyncEventId:
			handleSyncEvent( ev );
			break;
		
		default:
			mDispatcher.dispatchEvent( ev );
			ev->Release();
			break;
	}
	
	return done;
}